

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O1

int BackwardReferencesLz77
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs)

{
  uint uVar1;
  uint32_t *puVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 in_register_0000000c;
  uint uVar6;
  long lVar7;
  long lVar8;
  PixOrCopy v;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int len_ini;
  int iVar14;
  int local_50;
  
  iVar13 = xsize * ysize;
  puVar2 = hash_chain[1].offset_length;
  if (puVar2 != (uint32_t *)0x0) {
    uVar5 = *(undefined4 *)&hash_chain[1].field_0xc;
    puVar2[0] = hash_chain[1].size;
    puVar2[1] = uVar5;
  }
  uVar5 = *(undefined4 *)&hash_chain->field_0xc;
  hash_chain[1].size = hash_chain->size;
  *(undefined4 *)&hash_chain[1].field_0xc = uVar5;
  hash_chain[1].offset_length = (uint32_t *)&hash_chain->size;
  iVar14 = 0;
  hash_chain[2].offset_length = (uint32_t *)0x0;
  *(undefined8 *)&hash_chain->size = 0;
  if (0 < iVar13) {
    local_50 = -1;
    do {
      uVar1 = *(uint *)(*(long *)CONCAT44(in_register_0000000c,cache_bits) + (long)iVar14 * 4);
      uVar6 = uVar1 & 0xfff;
      if (uVar6 < 4) {
        uVar6 = 1;
      }
      else {
        iVar4 = uVar6 + iVar14;
        if (iVar13 <= (int)(uVar6 + iVar14)) {
          iVar4 = iVar13 + -1;
        }
        if (local_50 < iVar14) {
          local_50 = iVar14;
        }
        lVar8 = (long)local_50;
        iVar9 = 0;
        do {
          lVar7 = lVar8 + 1;
          if (iVar4 <= lVar8) break;
          uVar11 = *(uint *)(*(long *)CONCAT44(in_register_0000000c,cache_bits) + lVar7 * 4) & 0xfff
          ;
          if (uVar11 < 4) {
            uVar11 = 1;
          }
          iVar12 = uVar11 + (int)lVar7;
          iVar10 = iVar9;
          if (iVar9 < iVar12) {
            uVar6 = (int)lVar7 - iVar14;
            iVar10 = iVar12;
          }
          bVar3 = iVar12 <= iVar9;
          lVar8 = lVar7;
          iVar9 = iVar10;
        } while (bVar3 || iVar12 < iVar13);
      }
      if (uVar6 == 1) {
        v = (PixOrCopy)((ulong)argb[iVar14] << 0x20 | 0x10000);
      }
      else {
        v = (PixOrCopy)(CONCAT44(uVar1 >> 0xc,uVar6 << 0x10) + 2);
      }
      VP8LBackwardRefsCursorAdd((VP8LBackwardRefs *)hash_chain,v);
      iVar14 = iVar14 + uVar6;
    } while (iVar14 < iVar13);
  }
  return (int)(*(int *)((long)&hash_chain->offset_length + 4) == 0);
}

Assistant:

static int BackwardReferencesLz77(int xsize, int ysize,
                                  const uint32_t* const argb, int cache_bits,
                                  const VP8LHashChain* const hash_chain,
                                  VP8LBackwardRefs* const refs) {
  int i;
  int i_last_check = -1;
  int ok = 0;
  int cc_init = 0;
  const int use_color_cache = (cache_bits > 0);
  const int pix_count = xsize * ysize;
  VP8LColorCache hashers;

  if (use_color_cache) {
    cc_init = VP8LColorCacheInit(&hashers, cache_bits);
    if (!cc_init) goto Error;
  }
  VP8LClearBackwardRefs(refs);
  for (i = 0; i < pix_count;) {
    // Alternative#1: Code the pixels starting at 'i' using backward reference.
    int offset = 0;
    int len = 0;
    int j;
    VP8LHashChainFindCopy(hash_chain, i, &offset, &len);
    if (len >= MIN_LENGTH) {
      const int len_ini = len;
      int max_reach = 0;
      const int j_max =
          (i + len_ini >= pix_count) ? pix_count - 1 : i + len_ini;
      // Only start from what we have not checked already.
      i_last_check = (i > i_last_check) ? i : i_last_check;
      // We know the best match for the current pixel but we try to find the
      // best matches for the current pixel AND the next one combined.
      // The naive method would use the intervals:
      // [i,i+len) + [i+len, length of best match at i+len)
      // while we check if we can use:
      // [i,j) (where j<=i+len) + [j, length of best match at j)
      for (j = i_last_check + 1; j <= j_max; ++j) {
        const int len_j = VP8LHashChainFindLength(hash_chain, j);
        const int reach =
            j + (len_j >= MIN_LENGTH ? len_j : 1);  // 1 for single literal.
        if (reach > max_reach) {
          len = j - i;
          max_reach = reach;
          if (max_reach >= pix_count) break;
        }
      }
    } else {
      len = 1;
    }
    // Go with literal or backward reference.
    assert(len > 0);
    if (len == 1) {
      AddSingleLiteral(argb[i], use_color_cache, &hashers, refs);
    } else {
      VP8LBackwardRefsCursorAdd(refs, PixOrCopyCreateCopy(offset, len));
      if (use_color_cache) {
        for (j = i; j < i + len; ++j) VP8LColorCacheInsert(&hashers, argb[j]);
      }
    }
    i += len;
  }

  ok = !refs->error;
 Error:
  if (cc_init) VP8LColorCacheClear(&hashers);
  return ok;
}